

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m256v_permute_rows(m256v *M,int *rowperm)

{
  uint uVar1;
  size_t sVar2;
  uint8_t *puVar3;
  ulong uVar4;
  int iVar5;
  long lVar7;
  size_t __n;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  void *__dest;
  void *__s;
  undefined8 uStack_40;
  ulong local_38;
  ulong uVar6;
  
  uVar1 = M->n_row;
  lVar7 = -((ulong)uVar1 + 0xf & 0xfffffffffffffff0);
  __s = (void *)((long)&local_38 + lVar7);
  if (0 < (int)uVar1) {
    *(undefined8 *)((long)&uStack_40 + lVar7) = 0x104443;
    memset(__s,0,(ulong)uVar1);
  }
  __n = (size_t)(uint)M->n_col;
  __dest = (void *)((long)__s - (__n + 0xf & 0xfffffffffffffff0));
  if (0 < M->n_row) {
    uVar10 = 0;
    local_38 = __n;
    do {
      if (*(char *)((long)__s + uVar10) == '\0') {
        if (uVar10 == (uint)rowperm[uVar10]) {
          *(undefined1 *)((long)__s + uVar10) = 1;
        }
        else {
          if (0 < (int)__n) {
            sVar2 = M->rstride;
            puVar3 = M->e;
            *(undefined8 *)((long)__dest + -8) = 0x10449f;
            memcpy(__dest,puVar3 + sVar2 * uVar10,__n);
            __n = local_38;
          }
          iVar5 = (int)uVar10;
          if (uVar10 != (uint)rowperm[uVar10]) {
            uVar4 = (ulong)(uint)rowperm[uVar10];
            uVar8 = uVar10 & 0xffffffff;
            do {
              uVar6 = uVar4;
              iVar5 = (int)uVar6;
              lVar7 = (long)iVar5;
              *(undefined1 *)((long)__s + lVar7) = 1;
              if (0 < M->n_col) {
                lVar9 = 0;
                do {
                  M->e[lVar9 + M->rstride * (long)(int)uVar8] = M->e[lVar9 + M->rstride * lVar7];
                  lVar9 = lVar9 + 1;
                } while (lVar9 < M->n_col);
              }
              uVar4 = (ulong)(uint)rowperm[lVar7];
              uVar8 = uVar6;
            } while (uVar10 != (uint)rowperm[lVar7]);
          }
          *(undefined1 *)((long)__s + uVar10) = 1;
          if (0 < M->n_col) {
            lVar7 = 0;
            do {
              M->e[lVar7 + M->rstride * (long)iVar5] = *(uint8_t *)((long)__dest + lVar7);
              lVar7 = lVar7 + 1;
            } while (lVar7 < M->n_col);
          }
        }
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)M->n_row);
  }
  return;
}

Assistant:

void MV_GEN_N(_permute_rows)(MV_GEN_TYPE* M, const int* rowperm)
{
	char visited[M->n_row];
	for (int i = 0; i < M->n_row; ++i)
		visited[i] = 0;

	MV_GEN_N(_Def)(rowbuf_mat, rowbuf, 1, M->n_col)
	for (int i = 0; i < M->n_row; ++i) {
		if (visited[i])
			continue;
		if (rowperm[i] == i) {
			/* Simple case of a self-cycle; do nothing. */
			visited[i] = 1;
			continue;
		}

		/* Otherwise we need to shuffle things around. */
		MV_GEN_N(_copy_row)(M, i, &rowbuf_mat, 0);
		int e = i, e_next = rowperm[i];
		while (e_next != i) {
			assert(!visited[e_next]);
			visited[e_next] = 1;
			MV_GEN_N(_copy_row)(M, e_next, M, e);

			/* Advance in the cycle */
			e = e_next;
			e_next = rowperm[e_next];
		}
		visited[i] = 1;
		MV_GEN_N(_copy_row)(&rowbuf_mat, 0, M, e);
	}
}